

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_builder.cpp
# Opt level: O1

string * __thiscall
bidfx_public_api::price::subject::SubjectBuilder::GetComponent
          (string *__return_storage_ptr__,SubjectBuilder *this,string *key)

{
  pointer pbVar1;
  pointer __s2;
  size_t sVar2;
  size_t __n;
  _Alloc_hider _Var3;
  int iVar4;
  size_type *psVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  pbVar1 = (this->components_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(this->components_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (lVar6 != 0) {
    uVar7 = lVar6 >> 5;
    __s2 = (key->_M_dataplus)._M_p;
    sVar2 = key->_M_string_length;
    psVar5 = &pbVar1[1]._M_string_length;
    uVar8 = 1;
    do {
      __n = psVar5[-4];
      if ((__n == sVar2) && ((__n == 0 || (iVar4 = bcmp((void *)psVar5[-5],__s2,__n), iVar4 == 0))))
      {
        if (uVar8 < uVar7) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          _Var3._M_p = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (psVar5 + -1))->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)__return_storage_ptr__,_Var3._M_p,_Var3._M_p + *psVar5);
          return __return_storage_ptr__;
        }
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8
                   ,uVar7);
      }
      psVar5 = psVar5 + 8;
      uVar9 = uVar8 + 1;
      uVar8 = uVar8 + 2;
    } while (uVar9 < uVar7);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string SubjectBuilder::GetComponent(const std::string& key)
{
    for (unsigned long i = 0; i < components_.size(); i+= 2)
    {
        if ((components_.at(i)) == key)
        {
            return components_.at(i + 1);
        }
    }

    return "";
}